

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp,int op_type)

{
  undefined4 in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000010;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  
  if (in_stack_00000010 == 0) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 1) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 2) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 3) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 4) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 5) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 6) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 7) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_rsub>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 8) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_rdiv>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 9) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 10) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  else if (in_stack_00000010 == 0xb) {
    binary_op_vector<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
              (in_RSI,in_RDX,(float *)CONCAT44(in_ECX,in_R8D),in_R9D,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,unaff_retaddr);
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp, int op_type)
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_vector<binary_op_add>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_vector<binary_op_sub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_vector<binary_op_mul>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_vector<binary_op_div>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_vector<binary_op_max>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_vector<binary_op_min>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_POW) return binary_op_vector<binary_op_pow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_vector<binary_op_rsub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_vector<binary_op_rdiv>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_vector<binary_op_rpow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_vector<binary_op_atan2>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_vector<binary_op_ratan2>(ptr, ptr1, outptr, aw, bw, ap, bp);

    // should never reach here
}